

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

Token * __thiscall OpenMD::SelectionCompiler::tokenNext(SelectionCompiler *this)

{
  size_type sVar1;
  size_type sVar2;
  long in_RSI;
  Token *in_RDI;
  Token *in_stack_ffffffffffffffc8;
  Token *this_00;
  
  sVar1 = *(size_type *)(in_RSI + 0x130);
  this_00 = in_RDI;
  sVar2 = std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::size
                    ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)(in_RSI + 0x118));
  if (sVar1 == sVar2) {
    memset(this_00,0,0x18);
    Token::Token((Token *)0x2f46e5);
  }
  else {
    sVar1 = *(size_type *)(in_RSI + 0x130);
    *(size_type *)(in_RSI + 0x130) = sVar1 + 1;
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator[]
              ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)(in_RSI + 0x118),sVar1);
    Token::Token(this_00,in_stack_ffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

Token SelectionCompiler::tokenNext() {
    if (itokenInfix == atokenInfix.size()) { return Token(); }
    return atokenInfix[itokenInfix++];
  }